

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> __thiscall
S2Polygon::DestructiveApproxUnion
          (S2Polygon *this,
          vector<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::allocator<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>
          *polygons,S1Angle snap_radius)

{
  bool bVar1;
  size_type sVar2;
  pointer ppVar3;
  pointer pSVar4;
  pointer a;
  pointer b;
  _Rb_tree_iterator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>
  local_130;
  undefined4 local_124;
  _Base_ptr local_120;
  undefined1 local_114 [20];
  double local_100;
  unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> local_f8;
  scalar union_polygon;
  unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> local_e0;
  unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> b_polygon;
  int b_size;
  unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> local_b8;
  unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> a_polygon;
  iterator iStack_a8;
  int a_size;
  iterator smallest_it;
  undefined1 local_84 [20];
  reference local_70;
  unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> *polygon;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::allocator<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>
  *__range1;
  QueueType queue;
  vector<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::allocator<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>
  *polygons_local;
  S1Angle snap_radius_local;
  
  queue._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)polygons;
  std::
  multimap<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>_>
  ::multimap((multimap<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>_>
              *)&__range1);
  __end1 = std::
           vector<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::allocator<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>
           ::begin(polygons);
  polygon = (unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> *)
            std::
            vector<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::allocator<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>
            ::end(polygons);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_*,_std::vector<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::allocator<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>_>
                                     *)&polygon), bVar1) {
    local_70 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_*,_std::vector<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::allocator<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>_>
               ::operator*(&__end1);
    pSVar4 = std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>::operator->(local_70);
    local_84._0_4_ = num_vertices(pSVar4);
    std::make_pair<int,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>
              ((int *)(local_84 + 4),
               (unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> *)local_84);
    smallest_it._M_node =
         (_Base_ptr)
         std::
         multimap<int,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>>
         ::insert<std::pair<int,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>
                   ((multimap<int,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>>
                     *)&__range1,
                    (pair<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_> *)
                    (local_84 + 4));
    std::pair<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>::~pair
              ((pair<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_> *)
               (local_84 + 4));
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_*,_std::vector<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::allocator<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>_>
    ::operator++(&__end1);
  }
  while (sVar2 = std::
                 multimap<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>_>
                 ::size((multimap<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>_>
                         *)&__range1), 1 < sVar2) {
    iStack_a8 = std::
                multimap<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>_>
                ::begin((multimap<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>_>
                         *)&__range1);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>
             ::operator->(&stack0xffffffffffffff58);
    a_polygon._M_t.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
    super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
    super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl._4_4_ = ppVar3->first;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>
             ::operator->(&stack0xffffffffffffff58);
    std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>::unique_ptr
              (&local_b8,&ppVar3->second);
    std::
    multimap<int,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>>
    ::erase_abi_cxx11_((multimap<int,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>>
                        *)&__range1,iStack_a8);
    iStack_a8 = std::
                multimap<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>_>
                ::begin((multimap<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>_>
                         *)&__range1);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>
             ::operator->(&stack0xffffffffffffff58);
    b_polygon._M_t.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
    super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
    super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl._4_4_ = ppVar3->first;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>
             ::operator->(&stack0xffffffffffffff58);
    std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>::unique_ptr
              (&local_e0,&ppVar3->second);
    union_polygon._M_t.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
    super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
    super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl =
         (__uniq_ptr_data<S2Polygon,_std::default_delete<S2Polygon>,_true,_true>)
         std::
         multimap<int,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>>
         ::erase_abi_cxx11_((multimap<int,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>>
                             *)&__range1,iStack_a8);
    absl::make_unique<S2Polygon>();
    pSVar4 = std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>::operator->(&local_f8);
    a = std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>::get(&local_b8);
    b = std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>::get(&local_e0);
    local_100 = snap_radius.radians_;
    InitToApproxUnion(pSVar4,a,b,snap_radius);
    local_114._0_4_ =
         a_polygon._M_t.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
         super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
         super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl._4_4_ +
         b_polygon._M_t.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
         super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
         super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl._4_4_;
    std::make_pair<int,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>
              ((int *)(local_114 + 4),
               (unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> *)local_114);
    local_120 = (_Base_ptr)
                std::
                multimap<int,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>>
                ::insert<std::pair<int,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>
                          ((multimap<int,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>>
                            *)&__range1,
                           (pair<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>
                            *)(local_114 + 4));
    std::pair<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>::~pair
              ((pair<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_> *)
               (local_114 + 4));
    std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>::~unique_ptr(&local_f8);
    std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>::~unique_ptr(&local_e0);
    std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>::~unique_ptr(&local_b8);
  }
  bVar1 = std::
          multimap<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>_>
          ::empty((multimap<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>_>
                   *)&__range1);
  if (bVar1) {
    absl::make_unique<S2Polygon>();
  }
  else {
    local_130._M_node =
         (_Base_ptr)
         std::
         multimap<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>_>
         ::begin((multimap<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>_>
                  *)&__range1);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>
             ::operator->(&local_130);
    std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>::unique_ptr
              ((unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> *)this,&ppVar3->second);
  }
  local_124 = 1;
  std::
  multimap<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>_>
  ::~multimap((multimap<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>_>
               *)&__range1);
  return (__uniq_ptr_data<S2Polygon,_std::default_delete<S2Polygon>,_true,_true>)
         (__uniq_ptr_data<S2Polygon,_std::default_delete<S2Polygon>,_true,_true>)this;
}

Assistant:

unique_ptr<S2Polygon> S2Polygon::DestructiveApproxUnion(
    vector<unique_ptr<S2Polygon>> polygons, S1Angle snap_radius) {
  // Effectively create a priority queue of polygons in order of number of
  // vertices.  Repeatedly union the two smallest polygons and add the result
  // to the queue until we have a single polygon to return.
  using QueueType = std::multimap<int, unique_ptr<S2Polygon>>;
  QueueType queue;  // Map from # of vertices to polygon.
  for (auto& polygon : polygons)
    queue.insert(std::make_pair(polygon->num_vertices(), std::move(polygon)));

  while (queue.size() > 1) {
    // Pop two simplest polygons from queue.
    QueueType::iterator smallest_it = queue.begin();
    int a_size = smallest_it->first;
    unique_ptr<S2Polygon> a_polygon(std::move(smallest_it->second));
    queue.erase(smallest_it);
    smallest_it = queue.begin();
    int b_size = smallest_it->first;
    unique_ptr<S2Polygon> b_polygon(std::move(smallest_it->second));
    queue.erase(smallest_it);

    // Union and add result back to queue.
    auto union_polygon = make_unique<S2Polygon>();
    union_polygon->InitToApproxUnion(a_polygon.get(), b_polygon.get(),
                                     snap_radius);
    queue.insert(std::make_pair(a_size + b_size, std::move(union_polygon)));
    // We assume that the number of vertices in the union polygon is the
    // sum of the number of vertices in the original polygons, which is not
    // always true, but will almost always be a decent approximation, and
    // faster than recomputing.
  }

  if (queue.empty())
    return make_unique<S2Polygon>();
  else
    return std::move(queue.begin()->second);
}